

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

void __thiscall FBX::Decoder::initVersion(Decoder *this)

{
  int iVar1;
  size_type __n;
  allocator_type local_2a;
  value_type_conflict local_29;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  iVar1 = readuInt(this);
  this->version = iVar1;
  __n = 0x19;
  if (iVar1 < 0x1d4c) {
    __n = 0xd;
  }
  this->blockLength = __n;
  this->isuInt32 = iVar1 < 0x1d4c;
  local_29 = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_28,__n,&local_29,&local_2a);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->blockData,&local_28);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Decoder::initVersion() {
        version = readuInt();

        if (version < 7500) {
            blockLength = 13;
            isuInt32 = true;
        } else {
            blockLength = 25;
            isuInt32 = false;
        }
        blockData = std::vector(blockLength, '\0');
    }